

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int mbedtls_aes_setkey_enc(mbedtls_aes_context *ctx,uchar *key,uint keybits)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t *puVar12;
  long lVar13;
  int aiStack_838 [256];
  int pow [256];
  
  if (keybits == 0x80) {
    iVar2 = 10;
  }
  else if (keybits == 0x100) {
    iVar2 = 0xe;
  }
  else {
    if (keybits != 0xc0) {
      return -0x20;
    }
    iVar2 = 0xc;
  }
  ctx->nr = iVar2;
  if (aes_init_done == '\0') {
    uVar7 = 1;
    for (lVar3 = 0; uVar10 = 0x1b, lVar3 != 0x100; lVar3 = lVar3 + 1) {
      pow[lVar3] = uVar7;
      aiStack_838[uVar7] = (int)lVar3;
      if (uVar7 < 0x80) {
        uVar10 = 0;
      }
      uVar7 = uVar7 * 2 & 0xff ^ uVar7 ^ uVar10;
    }
    uVar7 = 1;
    for (lVar3 = 0; lVar3 != 0x28; lVar3 = lVar3 + 4) {
      *(uint *)((long)RCON + lVar3) = uVar7;
      uVar8 = uVar10;
      if (uVar7 < 0x80) {
        uVar8 = 0;
      }
      uVar7 = uVar7 * 2 & 0xff ^ uVar8;
    }
    FSb[0] = 'c';
    RSb[99] = '\0';
    for (lVar3 = 1; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      uVar7 = pow[0xff - (long)aiStack_838[lVar3]];
      uVar8 = uVar7 >> 7 | uVar7 * 2;
      uVar4 = uVar8 & 0xff;
      uVar9 = uVar8 * 2 & 0xff;
      uVar11 = uVar4 >> 7 | uVar9;
      uVar8 = uVar11 * 2;
      uVar9 = uVar9 >> 7;
      uVar6 = uVar8 & 0xff;
      uVar5 = (long)(int)(uVar4 ^ uVar7 ^ uVar11 ^ (uVar9 | uVar6) ^
                         (uVar6 >> 7) + (uVar9 | uVar8 & 0x7f) * 2) ^ 99;
      FSb[lVar3] = (uchar)uVar5;
      RSb[uVar5] = (uchar)lVar3;
    }
    lVar3 = 0;
    for (lVar13 = 0; lVar13 != 0x400; lVar13 = lVar13 + 4) {
      bVar1 = FSb[lVar3];
      uVar8 = 0;
      uVar7 = uVar10;
      if (-1 < (char)bVar1) {
        uVar7 = 0;
      }
      uVar7 = (uint)bVar1 + (uint)bVar1 & 0xff ^ uVar7;
      uVar4 = uVar7 ^ bVar1;
      uVar6 = uVar4 << 0x18 | (uint)bVar1 << 0x10 | (uint)bVar1 << 8;
      uVar9 = uVar6 | uVar7;
      *(uint *)((long)FT0 + lVar13) = uVar9;
      *(uint *)((long)FT1 + lVar13) = uVar9 << 8 | uVar4;
      *(uint *)((long)FT2 + lVar13) = uVar9 << 0x10 | uVar6 >> 0x10;
      *(uint *)((long)FT3 + lVar13) = uVar7 << 0x18 | uVar6 >> 8;
      if ((ulong)RSb[lVar3] != 0) {
        iVar2 = aiStack_838[RSb[lVar3]];
        uVar8 = pow[(iVar2 + aiStack_838[0xb]) % 0xff] << 0x18 ^
                pow[(iVar2 + aiStack_838[0xd]) % 0xff] << 0x10 ^
                pow[(iVar2 + aiStack_838[9]) % 0xff] << 8 ^ pow[(iVar2 + aiStack_838[0xe]) % 0xff];
      }
      *(uint *)((long)RT0 + lVar13) = uVar8;
      *(uint *)((long)RT1 + lVar13) = uVar8 << 8 | uVar8 >> 0x18;
      *(uint *)((long)RT2 + lVar13) = uVar8 << 0x10 | uVar8 >> 0x10;
      *(uint *)((long)RT3 + lVar13) = uVar8 << 0x18 | uVar8 >> 8;
      lVar3 = lVar3 + 1;
    }
    aes_init_done = '\x01';
  }
  puVar12 = ctx->buf;
  ctx->rk = puVar12;
  iVar2 = mbedtls_aesni_has_support(0x2000000);
  if (iVar2 == 0) {
    for (uVar5 = 0; keybits >> 5 != uVar5; uVar5 = uVar5 + 1) {
      ctx->buf[uVar5] = *(uint32_t *)(key + uVar5 * 4);
    }
    iVar2 = ctx->nr;
    if (iVar2 == 10) {
      for (lVar3 = 0; lVar3 != 0x28; lVar3 = lVar3 + 4) {
        uVar7 = ctx->buf[lVar3 + 3];
        uVar10 = (uint)FSb[uVar7 & 0xff] << 0x18 ^ (uint)FSb[uVar7 >> 0x18] << 0x10 ^
                 (uint)FSb[uVar7 >> 0x10 & 0xff] << 8 ^
                 (uint)FSb[uVar7 >> 8 & 0xff] ^ *(uint *)((long)RCON + lVar3) ^ puVar12[lVar3];
        ctx->buf[lVar3 + 4] = uVar10;
        uVar10 = uVar10 ^ ctx->buf[lVar3 + 1];
        ctx->buf[lVar3 + 5] = uVar10;
        uVar10 = uVar10 ^ ctx->buf[lVar3 + 2];
        ctx->buf[lVar3 + 6] = uVar10;
        ctx->buf[lVar3 + 7] = uVar10 ^ uVar7;
      }
    }
    else if (iVar2 == 0xc) {
      for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 4) {
        uVar7 = puVar12[5];
        uVar10 = (uint)FSb[uVar7 & 0xff] << 0x18 ^ (uint)FSb[uVar7 >> 0x18] << 0x10 ^
                 (uint)FSb[uVar7 >> 0x10 & 0xff] << 8 ^
                 (uint)FSb[uVar7 >> 8 & 0xff] ^ *(uint *)((long)RCON + lVar3) ^ *puVar12;
        puVar12[6] = uVar10;
        uVar10 = uVar10 ^ puVar12[1];
        puVar12[7] = uVar10;
        uVar10 = uVar10 ^ puVar12[2];
        puVar12[8] = uVar10;
        uVar10 = uVar10 ^ puVar12[3];
        puVar12[9] = uVar10;
        uVar10 = uVar10 ^ puVar12[4];
        puVar12[10] = uVar10;
        puVar12[0xb] = uVar10 ^ uVar7;
        puVar12 = puVar12 + 6;
      }
    }
    else if (iVar2 == 0xe) {
      for (lVar3 = 0; lVar3 != 0x1c; lVar3 = lVar3 + 4) {
        uVar7 = ctx->buf[lVar3 * 2 + 7];
        uVar10 = (uint)FSb[uVar7 & 0xff] << 0x18 ^ (uint)FSb[uVar7 >> 0x18] << 0x10 ^
                 (uint)FSb[uVar7 >> 0x10 & 0xff] << 8 ^
                 (uint)FSb[uVar7 >> 8 & 0xff] ^ *(uint *)((long)RCON + lVar3) ^ puVar12[lVar3 * 2];
        ctx->buf[lVar3 * 2 + 8] = uVar10;
        uVar10 = uVar10 ^ ctx->buf[lVar3 * 2 + 1];
        ctx->buf[lVar3 * 2 + 9] = uVar10;
        uVar10 = uVar10 ^ ctx->buf[lVar3 * 2 + 2];
        ctx->buf[lVar3 * 2 + 10] = uVar10;
        uVar10 = uVar10 ^ ctx->buf[lVar3 * 2 + 3];
        ctx->buf[lVar3 * 2 + 0xb] = uVar10;
        uVar10 = (uint)FSb[uVar10 >> 0x18] << 0x18 ^ (uint)FSb[uVar10 >> 0x10 & 0xff] << 0x10 ^
                 (uint)FSb[uVar10 >> 8 & 0xff] << 8 ^
                 (uint)FSb[uVar10 & 0xff] ^ ctx->buf[lVar3 * 2 + 4];
        ctx->buf[lVar3 * 2 + 0xc] = uVar10;
        uVar10 = uVar10 ^ ctx->buf[lVar3 * 2 + 5];
        ctx->buf[lVar3 * 2 + 0xd] = uVar10;
        uVar10 = uVar10 ^ ctx->buf[lVar3 * 2 + 6];
        ctx->buf[lVar3 * 2 + 0xe] = uVar10;
        ctx->buf[lVar3 * 2 + 0xf] = uVar10 ^ uVar7;
      }
    }
    return 0;
  }
  iVar2 = mbedtls_aesni_setkey_enc((uchar *)ctx->rk,key,(ulong)keybits);
  return iVar2;
}

Assistant:

int mbedtls_aes_setkey_enc( mbedtls_aes_context *ctx, const unsigned char *key,
                    unsigned int keybits )
{
    unsigned int i;
    uint32_t *RK;

    AES_VALIDATE_RET( ctx != NULL );
    AES_VALIDATE_RET( key != NULL );

    switch( keybits )
    {
        case 128: ctx->nr = 10; break;
        case 192: ctx->nr = 12; break;
        case 256: ctx->nr = 14; break;
        default : return( MBEDTLS_ERR_AES_INVALID_KEY_LENGTH );
    }

#if !defined(MBEDTLS_AES_ROM_TABLES)
    if( aes_init_done == 0 )
    {
        aes_gen_tables();
        aes_init_done = 1;
    }
#endif

#if defined(MBEDTLS_PADLOCK_C) && defined(MBEDTLS_PADLOCK_ALIGN16)
    if( aes_padlock_ace == -1 )
        aes_padlock_ace = mbedtls_padlock_has_support( MBEDTLS_PADLOCK_ACE );

    if( aes_padlock_ace )
        ctx->rk = RK = MBEDTLS_PADLOCK_ALIGN16( ctx->buf );
    else
#endif
    ctx->rk = RK = ctx->buf;

#if defined(MBEDTLS_AESNI_C) && defined(MBEDTLS_HAVE_X86_64)
    if( mbedtls_aesni_has_support( MBEDTLS_AESNI_AES ) )
        return( mbedtls_aesni_setkey_enc( (unsigned char *) ctx->rk, key, keybits ) );
#endif

    for( i = 0; i < ( keybits >> 5 ); i++ )
    {
        GET_UINT32_LE( RK[i], key, i << 2 );
    }

    switch( ctx->nr )
    {
        case 10:

            for( i = 0; i < 10; i++, RK += 4 )
            {
                RK[4]  = RK[0] ^ RCON[i] ^
                ( (uint32_t) FSb[ ( RK[3] >>  8 ) & 0xFF ]       ) ^
                ( (uint32_t) FSb[ ( RK[3] >> 16 ) & 0xFF ] <<  8 ) ^
                ( (uint32_t) FSb[ ( RK[3] >> 24 ) & 0xFF ] << 16 ) ^
                ( (uint32_t) FSb[ ( RK[3]       ) & 0xFF ] << 24 );

                RK[5]  = RK[1] ^ RK[4];
                RK[6]  = RK[2] ^ RK[5];
                RK[7]  = RK[3] ^ RK[6];
            }
            break;

        case 12:

            for( i = 0; i < 8; i++, RK += 6 )
            {
                RK[6]  = RK[0] ^ RCON[i] ^
                ( (uint32_t) FSb[ ( RK[5] >>  8 ) & 0xFF ]       ) ^
                ( (uint32_t) FSb[ ( RK[5] >> 16 ) & 0xFF ] <<  8 ) ^
                ( (uint32_t) FSb[ ( RK[5] >> 24 ) & 0xFF ] << 16 ) ^
                ( (uint32_t) FSb[ ( RK[5]       ) & 0xFF ] << 24 );

                RK[7]  = RK[1] ^ RK[6];
                RK[8]  = RK[2] ^ RK[7];
                RK[9]  = RK[3] ^ RK[8];
                RK[10] = RK[4] ^ RK[9];
                RK[11] = RK[5] ^ RK[10];
            }
            break;

        case 14:

            for( i = 0; i < 7; i++, RK += 8 )
            {
                RK[8]  = RK[0] ^ RCON[i] ^
                ( (uint32_t) FSb[ ( RK[7] >>  8 ) & 0xFF ]       ) ^
                ( (uint32_t) FSb[ ( RK[7] >> 16 ) & 0xFF ] <<  8 ) ^
                ( (uint32_t) FSb[ ( RK[7] >> 24 ) & 0xFF ] << 16 ) ^
                ( (uint32_t) FSb[ ( RK[7]       ) & 0xFF ] << 24 );

                RK[9]  = RK[1] ^ RK[8];
                RK[10] = RK[2] ^ RK[9];
                RK[11] = RK[3] ^ RK[10];

                RK[12] = RK[4] ^
                ( (uint32_t) FSb[ ( RK[11]       ) & 0xFF ]       ) ^
                ( (uint32_t) FSb[ ( RK[11] >>  8 ) & 0xFF ] <<  8 ) ^
                ( (uint32_t) FSb[ ( RK[11] >> 16 ) & 0xFF ] << 16 ) ^
                ( (uint32_t) FSb[ ( RK[11] >> 24 ) & 0xFF ] << 24 );

                RK[13] = RK[5] ^ RK[12];
                RK[14] = RK[6] ^ RK[13];
                RK[15] = RK[7] ^ RK[14];
            }
            break;
    }

    return( 0 );
}